

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ANTLRException.hpp
# Opt level: O0

void __thiscall antlr::ANTLRException::~ANTLRException(ANTLRException *this)

{
  void *in_RDI;
  
  ~ANTLRException((ANTLRException *)0x22b918);
  operator_delete(in_RDI,0x28);
  return;
}

Assistant:

virtual ~ANTLRException() throw()
	{
	}